

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblackoilanalysis.cpp
# Opt level: O0

void TPZBlackOilAnalysis::Flow
               (TPZBlackOilAnalysis *an,int matid,double *WaterFlowSC,double *OilFlowSC,
               double *WaterFlowBottom,double *OilFlowBottom)

{
  int iVar1;
  TPZFMatrix<double> *pTVar2;
  int64_t iVar3;
  TPZCompEl **ppTVar4;
  long *plVar5;
  TPZGeoEl *pTVar6;
  TPZGeoEl *pTVar7;
  TPZCompEl *pTVar8;
  long lVar9;
  double *pdVar10;
  double *in_RCX;
  double *in_RDX;
  int in_ESI;
  TPZAnalysis *in_RDI;
  double *in_R8;
  double *in_R9;
  TPZBlackOil2P3D *bo;
  TPZBndCondT<double> *bc;
  BFadREAL Bo;
  BFadREAL po;
  TPZInterfaceElement *face;
  TPZCompEl *cel;
  int iel;
  int nel;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  TPZVec<double> sol;
  TPZVec<double> qsi;
  TPZCompMesh *cmesh;
  int64_t in_stack_ffffffffffff7758;
  TPZElementMatrixT<double> *in_stack_ffffffffffff7760;
  TFad<4,_double> *in_stack_ffffffffffff7768;
  TFad<4,_double> *in_stack_ffffffffffff7770;
  double in_stack_ffffffffffff7778;
  TPZFMatrix<double> *in_stack_ffffffffffff7780;
  undefined8 in_stack_ffffffffffff7790;
  MType type;
  TPZCompMesh *in_stack_ffffffffffff7798;
  TPZElementMatrixT<double> *in_stack_ffffffffffff77a0;
  TPZBlackOil2P3D *local_8858;
  long *local_8848;
  long *local_8800;
  BFadREAL *in_stack_ffffffffffff78a0;
  BFadREAL *in_stack_ffffffffffff78a8;
  TPZBlackOil2P3D *in_stack_ffffffffffff78b0;
  int local_8710;
  undefined1 local_8708 [17216];
  undefined1 local_43c8 [17232];
  TPZVec<double> local_78;
  undefined1 local_58 [32];
  TPZCompMesh *local_38;
  double *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  int local_c;
  TPZAnalysis *local_8;
  
  type = (MType)((ulong)in_stack_ffffffffffff7790 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  TPZAnalysis::Solution(in_RDI);
  pTVar2 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                     ((TPZSolutionMatrix *)in_stack_ffffffffffff7760);
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xd])(in_RDI,pTVar2);
  local_38 = TPZAnalysis::Mesh(local_8);
  TPZVec<double>::TPZVec((TPZVec<double> *)in_stack_ffffffffffff7760,in_stack_ffffffffffff7758);
  TPZVec<double>::TPZVec((TPZVec<double> *)in_stack_ffffffffffff7760,in_stack_ffffffffffff7758);
  TPZElementMatrixT<double>::TPZElementMatrixT
            (in_stack_ffffffffffff77a0,in_stack_ffffffffffff7798,type);
  TPZElementMatrixT<double>::TPZElementMatrixT
            (in_stack_ffffffffffff77a0,in_stack_ffffffffffff7798,type);
  iVar3 = TPZCompMesh::NElements((TPZCompMesh *)0x1c5f197);
  *local_18 = 0.0;
  *local_20 = 0.0;
  *local_28 = 0.0;
  *local_30 = 0.0;
  for (local_8710 = 0; local_8710 < (int)iVar3; local_8710 = local_8710 + 1) {
    TPZCompMesh::ElementVec(local_38);
    ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)in_stack_ffffffffffff7780,
                         (int64_t)in_stack_ffffffffffff7778);
    pTVar8 = *ppTVar4;
    if (pTVar8 != (TPZCompEl *)0x0) {
      plVar5 = (long *)(**(code **)(*(long *)pTVar8 + 0xb8))();
      iVar1 = (**(code **)(*plVar5 + 0x58))();
      if (iVar1 == local_c) {
        if (pTVar8 == (TPZCompEl *)0x0) {
          local_8800 = (long *)0x0;
        }
        else {
          local_8800 = (long *)__dynamic_cast(pTVar8,&TPZCompEl::typeinfo,
                                              &TPZInterfaceElement::typeinfo,0);
        }
        if (local_8800 != (long *)0x0) {
          (**(code **)(*local_8800 + 0x108))(local_8800,local_43c8,local_8708);
          TPZInterfaceElement::LeftElement((TPZInterfaceElement *)0x1c5f3b3);
          pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffff7768);
          TPZInterfaceElement::LeftElement((TPZInterfaceElement *)0x1c5f3e1);
          pTVar7 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffff7768);
          iVar1 = (**(code **)(*(long *)pTVar7 + 0xf0))();
          (**(code **)(*(long *)pTVar6 + 0x260))(pTVar6,iVar1 + -1,local_58);
          pTVar8 = TPZInterfaceElement::LeftElement((TPZInterfaceElement *)0x1c5f453);
          (**(code **)(*(long *)pTVar8 + 0x1b0))(pTVar8,local_58,2,&local_78);
          TPZVec<double>::operator[](&local_78,0);
          TFad<4,_double>::TFad
                    (in_stack_ffffffffffff7770,(double *)in_stack_ffffffffffff7768,
                     (int)((ulong)in_stack_ffffffffffff7760 >> 0x20));
          TFad<4,_double>::TFad((TFad<4,_double> *)in_stack_ffffffffffff7760);
          lVar9 = (**(code **)(*local_8800 + 0xb8))();
          if (lVar9 == 0) {
            local_8848 = (long *)0x0;
          }
          else {
            local_8848 = (long *)__dynamic_cast(lVar9,&TPZMaterial::typeinfo,
                                                &TPZBndCondT<double>::typeinfo,0xfffffffffffffffe);
          }
          lVar9 = (**(code **)(*local_8848 + 0x50))();
          if (lVar9 == 0) {
            local_8858 = (TPZBlackOil2P3D *)0x0;
          }
          else {
            local_8858 = (TPZBlackOil2P3D *)
                         __dynamic_cast(lVar9,&TPZMaterial::typeinfo,&TPZBlackOil2P3D::typeinfo,0);
          }
          TFad<4,_double>::TFad(in_stack_ffffffffffff7770,in_stack_ffffffffffff7768);
          TPZBlackOil2P3D::Bo(in_stack_ffffffffffff78b0,in_stack_ffffffffffff78a8,
                              in_stack_ffffffffffff78a0);
          TFad<4,_double>::~TFad((TFad<4,_double> *)0x1c5f5fc);
          pdVar10 = TPZFMatrix<double>::operator()
                              (in_stack_ffffffffffff7780,(int64_t)in_stack_ffffffffffff7778,
                               (int64_t)in_stack_ffffffffffff7770);
          *local_20 = *pdVar10 * 86400.0 + *local_20;
          pdVar10 = TPZFMatrix<double>::operator()
                              (in_stack_ffffffffffff7780,(int64_t)in_stack_ffffffffffff7778,
                               (int64_t)in_stack_ffffffffffff7770);
          *local_18 = *pdVar10 * 86400.0 + *local_18;
          pdVar10 = TPZFMatrix<double>::operator()
                              (in_stack_ffffffffffff7780,(int64_t)in_stack_ffffffffffff7778,
                               (int64_t)in_stack_ffffffffffff7770);
          in_stack_ffffffffffff7778 = *pdVar10;
          in_stack_ffffffffffff7780 =
               (TPZFMatrix<double> *)
               TFad<4,_double>::val((TFad<4,_double> *)&stack0xffffffffffff7880);
          *local_30 = in_stack_ffffffffffff7778 *
                      (double)(in_stack_ffffffffffff7780->super_TPZMatrix<double>).
                              super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable * 86400.0 +
                      *local_30;
          in_stack_ffffffffffff7770 =
               (TFad<4,_double> *)
               TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffff7780,(int64_t)in_stack_ffffffffffff7778,
                          (int64_t)in_stack_ffffffffffff7770);
          in_stack_ffffffffffff7760 =
               (TPZElementMatrixT<double> *)
               (in_stack_ffffffffffff7770->super_TPZSavable)._vptr_TPZSavable;
          in_stack_ffffffffffff7768 = (TFad<4,_double> *)TPZBlackOil2P3D::Bw(local_8858);
          *local_28 = (double)in_stack_ffffffffffff7760 * (double)in_stack_ffffffffffff7768 *
                      86400.0 + *local_28;
          TFad<4,_double>::~TFad((TFad<4,_double> *)0x1c5f775);
          TFad<4,_double>::~TFad((TFad<4,_double> *)0x1c5f782);
        }
      }
    }
  }
  TPZElementMatrixT<double>::~TPZElementMatrixT(in_stack_ffffffffffff7760);
  TPZElementMatrixT<double>::~TPZElementMatrixT(in_stack_ffffffffffff7760);
  TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_ffffffffffff7760);
  TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_ffffffffffff7760);
  return;
}

Assistant:

void TPZBlackOilAnalysis::Flow(TPZBlackOilAnalysis &an, int matid, double & WaterFlowSC, double  & OilFlowSC, double & WaterFlowBottom, double  & OilFlowBottom){
	
	an.LoadSolution(an.Solution());
	TPZCompMesh * cmesh = an.Mesh();
	TPZVec<REAL> qsi(3);
    TPZVec<STATE> sol(1);
	
	TPZElementMatrixT<STATE> ek(cmesh, TPZElementMatrix::EK), ef(cmesh, TPZElementMatrix::EF);
	const int nel = cmesh->NElements();
	WaterFlowSC = 0.;
	OilFlowSC = 0.;
	WaterFlowBottom = 0.;
	OilFlowBottom = 0.;
	for(int iel = 0; iel < nel; iel++){
		TPZCompEl * cel = cmesh->ElementVec()[iel];
		if(!cel) continue;
		if(cel->Material()->Id() != matid) continue;
		TPZInterfaceElement * face = dynamic_cast<TPZInterfaceElement*>(cel);
		if(!face) continue;
		face->CalcStiff(ek, ef);
		
		face->LeftElement()->Reference()->CenterPoint(face->LeftElement()->Reference()->NSides()-1,qsi);
		face->LeftElement()->Solution(qsi, TPZBlackOil2P3D::EOilPressure, sol);
		
		TPZBlackOil2P3D::BFadREAL po(sol[0],0);
		TPZBlackOil2P3D::BFadREAL Bo;
		
		auto * bc =
			dynamic_cast<TPZBndCondT<STATE>*> (face->Material());
		auto * bo =
			dynamic_cast<TPZBlackOil2P3D *> (bc->Material());
		bo->Bo(po, Bo);
		
		OilFlowSC += ef.fMat(0,0)*86400.;
		WaterFlowSC += ef.fMat(1,0)*86400.;
		
		OilFlowBottom += ef.fMat(0,0)*Bo.val()*86400.;
		WaterFlowBottom += ef.fMat(1,0)*bo->Bw()*86400.;
	}//iel
}